

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_list_has_keys(lyd_node *list)

{
  lys_node *plVar1;
  bool bVar2;
  int local_2c;
  int i;
  lys_node_list *slist;
  lyd_node *iter;
  lyd_node *list_local;
  
  if (list->schema->nodetype != LYS_LIST) {
    __assert_fail("list->schema->nodetype == LYS_LIST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x56,"int lyd_list_has_keys(struct lyd_node *)");
  }
  plVar1 = list->schema;
  if (plVar1->padding[2] == '\0') {
    list_local._4_4_ = 1;
  }
  else {
    local_2c = 0;
    slist = (lys_node_list *)list->child;
    while( true ) {
      bVar2 = false;
      if (slist != (lys_node_list *)0x0) {
        bVar2 = local_2c < (int)(uint)plVar1->padding[2];
      }
      if (!bVar2) {
        if (local_2c < (int)(uint)plVar1->padding[2]) {
          return 0;
        }
        return 1;
      }
      if (slist->name != *(char **)(*(long *)&plVar1[1].flags + (long)local_2c * 8)) break;
      local_2c = local_2c + 1;
      slist = *(lys_node_list **)&slist->flags;
    }
    list_local._4_4_ = 0;
  }
  return list_local._4_4_;
}

Assistant:

int
lyd_list_has_keys(struct lyd_node *list)
{
    struct lyd_node *iter;
    struct lys_node_list *slist;
    int i;

    assert(list->schema->nodetype == LYS_LIST);

    /* even though hash is 0, it may be a valid hash, that is what we are going to check */

    slist = (struct lys_node_list *)list->schema;
    if (!slist->keys_size) {
        /* always has keys */
        return 1;
    }

    i = 0;
    iter = list->child;
    while (iter && (i < slist->keys_size)) {
        if (iter->schema != (struct lys_node *)slist->keys[i]) {
            /* missing key */
            return 0;
        }

        ++i;
        iter = iter->next;
    }
    if (i < slist->keys_size) {
        /* missing key */
        return 0;
    }

    /* all keys found */
    return 1;
}